

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::delete_xpath_variable(xpath_value_type type,xpath_variable *var)

{
  undefined4 in_EDI;
  
  switch(in_EDI) {
  case 1:
    delete_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_node_set>
              ((xpath_variable_node_set *)0x14ecfc);
    break;
  case 2:
    delete_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_number>
              ((xpath_variable_number *)0x14ed08);
    break;
  case 3:
    delete_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_string>
              ((xpath_variable_string *)0x14ed14);
    break;
  case 4:
    delete_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_boolean>
              ((xpath_variable_boolean *)0x14ed20);
  }
  return;
}

Assistant:

PUGI_IMPL_FN void delete_xpath_variable(xpath_value_type type, xpath_variable* var)
	{
		switch (type)
		{
		case xpath_type_node_set:
			delete_xpath_variable(static_cast<xpath_variable_node_set*>(var));
			break;

		case xpath_type_number:
			delete_xpath_variable(static_cast<xpath_variable_number*>(var));
			break;

		case xpath_type_string:
			delete_xpath_variable(static_cast<xpath_variable_string*>(var));
			break;

		case xpath_type_boolean:
			delete_xpath_variable(static_cast<xpath_variable_boolean*>(var));
			break;

		default:
			assert(false && "Invalid variable type"); // unreachable
		}
	}